

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_awaiter.hxx
# Opt level: O0

void __thiscall nuraft::EventAwaiter::invoke(EventAwaiter *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  atomic<nuraft::EventAwaiter::AS> *unaff_retaddr;
  unique_lock<std::mutex> l;
  AS expected;
  unique_lock<std::mutex> *in_stack_ffffffffffffffe0;
  memory_order in_stack_fffffffffffffff0;
  mutex_type *__e;
  
  __e = in_RDI;
  bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                    (unaff_retaddr,(AS *)in_RDI,idle,in_stack_fffffffffffffff0);
  if (!bVar1) {
    std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffe0,in_RDI);
    bVar1 = std::atomic<nuraft::EventAwaiter::AS>::compare_exchange_strong
                      (unaff_retaddr,(AS *)__e,ready,in_stack_fffffffffffffff0);
    if (!bVar1) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void invoke() {
        AS expected = AS::idle;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has not been invoked yet, do nothing.
            return;
        }

        std::unique_lock<std::mutex> l(cvLock);
        expected = AS::ready;
        if (status.compare_exchange_strong(expected, AS::done)) {
            // wait() has been called earlier than invoke(),
            // but invoke() has grabbed `cvLock` earlier than wait().
            // Do nothing.
        } else {
            // wait() is waiting for ack.
            cv.notify_all();
        }
    }